

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JlDataModelHelpers.c
# Opt level: O0

JL_STATUS JlCreateBoolObject(_Bool BoolValue,JlDataObject **pBoolObject)

{
  JlDataObject *local_28;
  JlDataObject *boolObject;
  JlDataObject **ppJStack_18;
  JL_STATUS jlStatus;
  JlDataObject **pBoolObject_local;
  _Bool BoolValue_local;
  
  local_28 = (JlDataObject *)0x0;
  if (pBoolObject == (JlDataObject **)0x0) {
    boolObject._4_4_ = JL_STATUS_INVALID_PARAMETER;
  }
  else {
    *pBoolObject = (JlDataObject *)0x0;
    ppJStack_18 = pBoolObject;
    pBoolObject_local._7_1_ = BoolValue;
    boolObject._4_4_ = JlCreateObject(JL_DATA_TYPE_BOOL,&local_28);
    if (boolObject._4_4_ == JL_STATUS_SUCCESS) {
      boolObject._4_4_ = JlSetObjectBool(local_28,(_Bool)(pBoolObject_local._7_1_ & 1));
      if (boolObject._4_4_ == JL_STATUS_SUCCESS) {
        *ppJStack_18 = local_28;
      }
      else {
        JlFreeObjectTree(&local_28);
      }
    }
  }
  return boolObject._4_4_;
}

Assistant:

JL_STATUS
    JlCreateBoolObject
    (
        bool                BoolValue,          // [in]
        JlDataObject**      pBoolObject         // [out]
    )
{
    JL_STATUS jlStatus;
    JlDataObject* boolObject = NULL;

    if( NULL != pBoolObject )
    {
        *pBoolObject = NULL;

        jlStatus = JlCreateObject( JL_DATA_TYPE_BOOL, &boolObject );
        if( JL_STATUS_SUCCESS == jlStatus )
        {
            jlStatus = JlSetObjectBool( boolObject, BoolValue );
            if( JL_STATUS_SUCCESS == jlStatus )
            {
                *pBoolObject = boolObject;
            }
            else
            {
                JlFreeObjectTree( &boolObject );
            }
        }
    }
    else
    {
        jlStatus = JL_STATUS_INVALID_PARAMETER;
    }

    return jlStatus;
}